

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
* embree::bezier_to_hermite_helper
            (pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
             *__return_storage_ptr__,
            vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            *indices,avector<Vec3ff> *positions)

{
  Vec3fx *pVVar1;
  float *pfVar2;
  Vec3fx *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Vec3fx *pVVar20;
  pointer pHVar21;
  size_t *psVar22;
  size_t i;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  pointer pHVar27;
  size_t sVar28;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_70;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> local_50;
  
  local_70.items = (Vec3fx *)0x0;
  local_70.size_active = 0;
  local_70.size_alloced = 0;
  pHVar21 = (indices->
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pHVar27 = (indices->
            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            )._M_impl.super__Vector_impl_data._M_start;
  sVar25 = (long)pHVar21 - (long)pHVar27 >> 2;
  lVar26 = (long)pHVar21 - (long)pHVar27;
  if (lVar26 == 0) {
    pVVar20 = (Vec3fx *)0x0;
    pHVar27 = pHVar21;
  }
  else {
    pVVar20 = (Vec3fx *)alignedMalloc(lVar26 * 4,0x10);
    local_70.items = pVVar20;
    alignedFree((void *)0x0);
    pHVar21 = (indices->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pHVar27 = (indices->
              super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_70.size_alloced = sVar25;
  }
  local_50.items = (Vec3fx *)0x0;
  sVar28 = (long)pHVar27 - (long)pHVar21 >> 2;
  local_50.size_active = 0;
  local_50.size_alloced = 0;
  local_70.size_active = sVar25;
  if (pHVar27 == pHVar21) {
    psVar22 = &local_50.size_active;
  }
  else {
    local_50.items = (Vec3fx *)alignedMalloc(((long)pHVar27 - (long)pHVar21) * 4,0x10);
    alignedFree((void *)0x0);
    psVar22 = &local_50.size_alloced;
    local_50.size_active = sVar28;
  }
  *psVar22 = sVar28;
  lVar26 = 0;
  for (uVar23 = 0;
      pHVar27 = (indices->
                super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                )._M_impl.super__Vector_impl_data._M_start,
      uVar23 < (ulong)((long)(indices->
                             super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar27 >> 3);
      uVar23 = uVar23 + 1) {
    uVar24 = (ulong)*(uint *)((long)&pHVar27->vertex + lVar26);
    pVVar3 = positions->items;
    pVVar1 = pVVar3 + uVar24;
    fVar4 = (pVVar1->field_0).m128[0];
    fVar5 = (pVVar1->field_0).m128[1];
    fVar6 = (pVVar1->field_0).m128[2];
    fVar7 = (pVVar1->field_0).m128[3];
    pVVar1 = pVVar3 + uVar24 + 1;
    fVar8 = (pVVar1->field_0).m128[0];
    fVar9 = (pVVar1->field_0).m128[1];
    fVar10 = (pVVar1->field_0).m128[2];
    fVar11 = (pVVar1->field_0).m128[3];
    pVVar1 = pVVar3 + uVar24 + 2;
    fVar12 = (pVVar1->field_0).m128[0];
    fVar13 = (pVVar1->field_0).m128[1];
    fVar14 = (pVVar1->field_0).m128[2];
    fVar15 = (pVVar1->field_0).m128[3];
    pVVar3 = pVVar3 + uVar24 + 3;
    fVar16 = (pVVar3->field_0).m128[0];
    fVar17 = (pVVar3->field_0).m128[1];
    fVar18 = (pVVar3->field_0).m128[2];
    fVar19 = (pVVar3->field_0).m128[3];
    pfVar2 = (pVVar20->field_0).m128 + lVar26;
    *pfVar2 = fVar4;
    pfVar2[1] = fVar5;
    pfVar2[2] = fVar6;
    pfVar2[3] = fVar7;
    pfVar2 = local_70.items[1].field_0.m128 + lVar26;
    *pfVar2 = fVar16;
    pfVar2[1] = fVar17;
    pfVar2[2] = fVar18;
    pfVar2[3] = fVar19;
    pfVar2 = ((local_50.items)->field_0).m128 + lVar26;
    *pfVar2 = (fVar8 - fVar4) * 3.0;
    pfVar2[1] = (fVar9 - fVar5) * 3.0;
    pfVar2[2] = (fVar10 - fVar6) * 3.0;
    pfVar2[3] = (fVar11 - fVar7) * 3.0;
    pfVar2 = local_50.items[1].field_0.m128 + lVar26;
    *pfVar2 = (fVar16 - fVar12) * 3.0;
    pfVar2[1] = (fVar17 - fVar13) * 3.0;
    pfVar2[2] = (fVar18 - fVar14) * 3.0;
    pfVar2[3] = (fVar19 - fVar15) * 3.0;
    lVar26 = lVar26 + 8;
    pVVar20 = local_70.items;
  }
  std::
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  ::
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_&,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_&,_true>
            (__return_storage_ptr__,&local_70,&local_50);
  alignedFree(local_50.items);
  alignedFree(local_70.items);
  return __return_storage_ptr__;
}

Assistant:

std::pair<avector<Vec3ff>,avector<Vec3ff>> bezier_to_hermite_helper(const std::vector<SceneGraph::HairSetNode::Hair>& indices, const avector<Vec3ff>& positions)
  {
    avector<Vec3ff> positions_o; positions_o.resize(2*indices.size());
    avector<Vec3ff> tangents_o;  tangents_o.resize(2*indices.size());
    
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i].vertex;
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      positions_o[2*i+0] = Vec3ff(v0);
      positions_o[2*i+1] = Vec3ff(v3);
      tangents_o[2*i+0] = Vec3ff(3.0f*(v1-v0));
      tangents_o[2*i+1] = Vec3ff(3.0f*(v3-v2));
    }
    return std::make_pair(positions_o,tangents_o);
  }